

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void __thiscall
QtPromisePrivate::PromiseError::PromiseError<QSharedPointer<int>>
          (PromiseError *this,QSharedPointer<int> *value)

{
  QSharedPointer<int> *this_00;
  
  (this->m_data)._M_exception_object = (void *)0x0;
  this_00 = (QSharedPointer<int> *)__cxa_allocate_exception(0x10);
  QSharedPointer<int>::QSharedPointer(this_00,value);
  __cxa_throw(this_00,&QSharedPointer<int>::typeinfo,QSharedPointer<int>::~QSharedPointer);
}

Assistant:

PromiseError(const T& value)
    {
        try {
            throw value;
        } catch (...) {
            m_data = std::current_exception();
        }
    }